

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_TryMergeDrawCmds(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *__s1;
  ImVector<ImDrawCmd> *in_RDI;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  
  __s1 = in_RDI->Data + (in_RDI->Size + -1);
  iVar1 = memcmp(__s1,__s1 + -1,0x1c);
  if ((((iVar1 == 0) && (__s1[-1].IdxOffset + __s1[-1].ElemCount == __s1->IdxOffset)) &&
      (__s1->UserCallback == (ImDrawCallback)0x0)) && (__s1[-1].UserCallback == (ImDrawCallback)0x0)
     ) {
    __s1[-1].ElemCount = __s1->ElemCount + __s1[-1].ElemCount;
    ImVector<ImDrawCmd>::pop_back(in_RDI);
  }
  return;
}

Assistant:

void ImDrawList::_TryMergeDrawCmds()
{
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (ImDrawCmd_HeaderCompare(curr_cmd, prev_cmd) == 0 && ImDrawCmd_AreSequentialIdxOffset(prev_cmd, curr_cmd) && curr_cmd->UserCallback == NULL && prev_cmd->UserCallback == NULL)
    {
        prev_cmd->ElemCount += curr_cmd->ElemCount;
        CmdBuffer.pop_back();
    }
}